

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_ids_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::CompactIdsPass::Process(CompactIdsPass *this)

{
  uint32_t uVar1;
  Status SVar2;
  IRContext *pIVar3;
  Module *pMVar4;
  size_type sVar5;
  anon_class_16_2_2e4785f4 local_80;
  function<void_(spvtools::opt::Instruction_*)> local_70;
  undefined1 local_50 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result_id_mapping;
  bool modified;
  CompactIdsPass *this_local;
  
  result_id_mapping._M_h._M_single_bucket._7_1_ = 0;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_50);
  pIVar3 = Pass::context(&this->super_Pass);
  IRContext::InvalidateAnalyses(pIVar3,kAnalysisDebugInfo);
  pIVar3 = Pass::context(&this->super_Pass);
  pMVar4 = IRContext::module(pIVar3);
  local_80.result_id_mapping =
       (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)local_50;
  local_80.modified = (bool *)((long)&result_id_mapping._M_h._M_single_bucket + 7);
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::CompactIdsPass::Process()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_70,&local_80);
  Module::ForEachInst(pMVar4,&local_70,true);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_70);
  pIVar3 = Pass::context(&this->super_Pass);
  pMVar4 = IRContext::module(pIVar3);
  uVar1 = Module::id_bound(pMVar4);
  sVar5 = std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::size((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)local_50);
  if ((ulong)uVar1 != sVar5 + 1) {
    result_id_mapping._M_h._M_single_bucket._7_1_ = 1;
    pIVar3 = Pass::context(&this->super_Pass);
    pMVar4 = IRContext::module(pIVar3);
    sVar5 = std::
            unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::size((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
    Module::SetIdBound(pMVar4,(int)sVar5 + 1);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::ResetFeatureManager(pIVar3);
  }
  SVar2 = SuccessWithoutChange;
  if ((result_id_mapping._M_h._M_single_bucket._7_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
  return SVar2;
}

Assistant:

Pass::Status CompactIdsPass::Process() {
  bool modified = false;
  std::unordered_map<uint32_t, uint32_t> result_id_mapping;

  // Disable automatic DebugInfo analysis for the life of the CompactIds pass.
  // The DebugInfo manager requires the SPIR-V to be valid to run, but this is
  // not true at all times in CompactIds as it remaps all ids.
  context()->InvalidateAnalyses(IRContext::kAnalysisDebugInfo);

  context()->module()->ForEachInst(
      [&result_id_mapping, &modified](Instruction* inst) {
        auto operand = inst->begin();
        while (operand != inst->end()) {
          const auto type = operand->type;
          if (spvIsIdType(type)) {
            assert(operand->words.size() == 1);
            uint32_t& id = operand->words[0];
            uint32_t new_id = GetRemappedId(&result_id_mapping, id);
            if (id != new_id) {
              modified = true;
              id = new_id;
              // Update data cached in the instruction object.
              if (type == SPV_OPERAND_TYPE_RESULT_ID) {
                inst->SetResultId(id);
              } else if (type == SPV_OPERAND_TYPE_TYPE_ID) {
                inst->SetResultType(id);
              }
            }
          }
          ++operand;
        }

        uint32_t scope_id = inst->GetDebugScope().GetLexicalScope();
        if (scope_id != kNoDebugScope) {
          uint32_t new_id = GetRemappedId(&result_id_mapping, scope_id);
          if (scope_id != new_id) {
            inst->UpdateLexicalScope(new_id);
            modified = true;
          }
        }
        uint32_t inlinedat_id = inst->GetDebugInlinedAt();
        if (inlinedat_id != kNoInlinedAt) {
          uint32_t new_id = GetRemappedId(&result_id_mapping, inlinedat_id);
          if (inlinedat_id != new_id) {
            inst->UpdateDebugInlinedAt(new_id);
            modified = true;
          }
        }
      },
      true);

  if (context()->module()->id_bound() != result_id_mapping.size() + 1) {
    modified = true;
    context()->module()->SetIdBound(
        static_cast<uint32_t>(result_id_mapping.size() + 1));
    // There are ids in the feature manager that could now be invalid
    context()->ResetFeatureManager();
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}